

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::AsmJsByteCodeWriter::AsmStartCall
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,ArgSlot ArgCount,bool isPatching)

{
  Data *this_00;
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ArgSlot local_2a [4];
  OpLayoutStartCall data;
  
  ByteCodeWriter::CheckOpen(&this->super_ByteCodeWriter);
  local_2a[0] = ArgCount;
  bVar3 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
  ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>(this_00,op,&this->super_ByteCodeWriter);
  if ((ushort)(op - StartCall) < 0xfff8) {
    puVar1 = &(this->super_ByteCodeWriter).m_byteCodeWithoutLDACount;
    *puVar1 = *puVar1 + 1;
  }
  if (!isPatching) {
    ByteCodeWriter::IncreaseByteCodeCount(&this->super_ByteCodeWriter);
  }
  ByteCodeWriter::Data::Write(this_00,local_2a,2);
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmStartCall(OpCodeAsmJs op, ArgSlot ArgCount, bool isPatching)
    {
        CheckOpen();

        OpLayoutStartCall data;
        data.ArgCount = ArgCount;
        m_byteCodeData.Encode(op, &data, sizeof(data), this, isPatching);
    }